

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.h
# Opt level: O2

char * ASDCP::i64sz(i64_t i,char *buf)

{
  if (buf != (char *)0x0) {
    snprintf(buf,0x40,"%lld",i);
    return buf;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.h",
                0x3b,"const char *ASDCP::i64sz(i64_t, char *)");
}

Assistant:

inline const char* i64sz(i64_t i, char* buf)
{ 
  assert(buf);
#ifdef WIN32
  snprintf(buf, IntBufferLen, "%I64d", i);
#else
  snprintf(buf, IntBufferLen, "%lld", i);
#endif
  return buf;
}